

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::eliminate_dropout(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int *piVar3;
  Layer *pLVar4;
  int iVar5;
  int iVar6;
  pointer ppLVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar12;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar8 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    uVar9 = 0xffffffff;
    lVar10 = 0;
    do {
      uVar13 = (ulong)uVar9;
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar10]->type);
      if (iVar5 == 0) {
        pLVar2 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
        if ((*(float *)&pLVar2[1]._vptr_Layer == 1.0) && (!NAN(*(float *)&pLVar2[1]._vptr_Layer))) {
          uVar11 = (int)lVar10 - 1;
          uVar12 = (ulong)uVar11;
          if ((int)uVar11 < 0) {
            if ((int)lVar10 != 0) {
              ppLVar7 = (((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start;
LAB_0014a93a:
              pLVar4 = ppLVar7[(int)uVar12];
              fprintf(_stderr,"eliminate_dropout %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                      (pLVar2->name)._M_dataplus._M_p);
              iVar5 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar5;
              (((this->super_ModelWriter).blobs)->
              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar5].producer = (int)uVar12;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar2->type,0,(char *)(pLVar2->type)._M_string_length,0x31f19a);
            }
          }
          else {
            iVar5 = *(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar6 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar13]->type);
              if (iVar6 != 0) {
                ppLVar7 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                piVar3 = (ppLVar7[uVar13]->tops).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if (((long)*(pointer *)
                            ((long)&(ppLVar7[uVar13]->tops).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                     (long)piVar3 == 4) && (uVar12 = uVar13, *piVar3 == iVar5)) goto LAB_0014a93a;
              }
              uVar13 = uVar13 - 1;
            } while (0 < (int)uVar13 + 1);
          }
        }
      }
      lVar10 = lVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Dropout")
            continue;

        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[i];
        if (dropout->scale != 1.f)
            continue;

        // Any - Dropout
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_dropout %s %s\n", any->name.c_str(), dropout->name.c_str());

        int top_blob_index_final = dropout->tops[0];
        any->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        dropout->type = "ncnnfused";
    }

    return 0;
}